

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrEnumerateEnvironmentBlendModes
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,
                   uint32_t environmentBlendModeCapacityInput,
                   uint32_t *environmentBlendModeCountOutput,
                   XrEnvironmentBlendMode *environmentBlendModes)

{
  long lVar1;
  bool bVar2;
  XrViewConfigurationType __val;
  uint32_t uVar3;
  uint uVar4;
  char cVar5;
  XrResult XVar6;
  uint uVar7;
  XrSystemId XVar8;
  ulong uVar9;
  char cVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  __hash_code __code;
  uint __len;
  _Hash_node_base *p_Var13;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_environmentBlendModeCapacityInput;
  ostringstream oss_environmentBlendModes;
  ostringstream oss_environmentBlendModeCountOutput;
  ostringstream oss_instance;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_678;
  uint32_t local_65c;
  _Hash_node_base *local_658;
  XrSystemId local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  unique_lock<std::mutex> local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_678.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_device = &g_instance_dispatch_mutex;
  local_1a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1a8);
  local_1a8._M_owns = true;
  p_Var11 = g_instance_dispatch_map._M_h._M_buckets
            [(ulong)instance % g_instance_dispatch_map._M_h._M_bucket_count];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var13 = p_Var11->_M_nxt, p_Var12 = p_Var11,
     (XrInstance)p_Var11->_M_nxt[1]._M_nxt != instance)) {
    while (p_Var11 = p_Var13, p_Var13 = p_Var11->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)p_Var13[1]._M_nxt % g_instance_dispatch_map._M_h._M_bucket_count !=
           (ulong)instance % g_instance_dispatch_map._M_h._M_bucket_count) ||
         (p_Var12 = p_Var11, (XrInstance)p_Var13[1]._M_nxt == instance)) goto LAB_0021a567;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_0021a567:
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var13 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var13 = p_Var12->_M_nxt;
  }
  if (p_Var13 == (_Hash_node_base *)0x0) {
    local_658 = (_Hash_node_base *)0x0;
  }
  else {
    local_658 = p_Var13[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
  if (p_Var13 == (_Hash_node_base *)0x0) {
    XVar6 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[33],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [9])"XrResult",
               (char (*) [33])"xrEnumerateEnvironmentBlendModes",(char (*) [1])0x2a4b54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    lVar1 = *(long *)((long)&local_1a8._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_190 + lVar1) = *(uint *)((long)auStack_190 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [11])"XrInstance",(char (*) [9])"instance",local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
      operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
    }
    cVar10 = '\x01';
    if (9 < systemId) {
      XVar8 = systemId;
      cVar5 = '\x04';
      do {
        cVar10 = cVar5;
        if (XVar8 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_0021a6ae;
        }
        if (XVar8 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_0021a6ae;
        }
        if (XVar8 < 10000) goto LAB_0021a6ae;
        bVar2 = 99999 < XVar8;
        XVar8 = XVar8 / 10000;
        cVar5 = cVar10 + '\x04';
      } while (bVar2);
      cVar10 = cVar10 + '\x01';
    }
LAB_0021a6ae:
    local_610[0]._M_dataplus._M_p = (pointer)&local_610[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_610,cVar10);
    local_65c = environmentBlendModeCapacityInput;
    local_650 = systemId;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_610[0]._M_dataplus._M_p,(uint)local_610[0]._M_string_length,systemId);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [11])"XrSystemId",(char (*) [9])"systemId",local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
      operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
    }
    __val = -viewConfigurationType;
    if (0 < (int)viewConfigurationType) {
      __val = viewConfigurationType;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_0021a788;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_0021a788;
        }
        if (uVar7 < 10000) goto LAB_0021a788;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_0021a788:
    local_610[0]._M_dataplus._M_p = (pointer)&local_610[0].field_2;
    std::__cxx11::string::_M_construct
              ((ulong)local_610,(char)__len - (char)((int)viewConfigurationType >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_610[0]._M_dataplus._M_p + (viewConfigurationType >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[24],char_const(&)[22],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [24])"XrViewConfigurationType",
               (char (*) [22])"viewConfigurationType",local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
      operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    XVar8 = local_650;
    uVar3 = local_65c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"0x",2);
    *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_610[0].field_2 +
                  *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_610);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[34],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [9])"uint32_t",
               (char (*) [34])"environmentBlendModeCapacityInput",local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[32],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [10])0x2a72f0,
               (char (*) [32])"environmentBlendModeCountOutput",local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
      operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_498[0].field_2 +
                  *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_498);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[24],char_const(&)[22],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_678,(char (*) [24])"XrEnvironmentBlendMode*",
               (char (*) [22])"environmentBlendModes",&local_648);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_628,&local_678);
    ApiDumpLayerRecordContent(&local_628);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_628);
    XVar6 = (*(code *)local_658[0xb]._M_nxt)
                      (instance,XVar8,viewConfigurationType,uVar3,environmentBlendModeCountOutput,
                       environmentBlendModes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    std::ios_base::~ios_base(local_5a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_678);
  return XVar6;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrEnumerateEnvironmentBlendModes(
    XrInstance instance,
    XrSystemId systemId,
    XrViewConfigurationType viewConfigurationType,
    uint32_t environmentBlendModeCapacityInput,
    uint32_t* environmentBlendModeCountOutput,
    XrEnvironmentBlendMode* environmentBlendModes) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
            auto map_iter = g_instance_dispatch_map.find(instance);
            if (map_iter == g_instance_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrEnumerateEnvironmentBlendModes", "");
        std::ostringstream oss_instance;
        oss_instance << std::hex << reinterpret_cast<const void*>(instance);
        contents.emplace_back("XrInstance", "instance", oss_instance.str());
        contents.emplace_back("XrSystemId", "systemId", std::to_string(systemId));
        contents.emplace_back("XrViewConfigurationType", "viewConfigurationType", std::to_string(viewConfigurationType));
        std::ostringstream oss_environmentBlendModeCapacityInput;
        oss_environmentBlendModeCapacityInput << "0x" << std::hex << (environmentBlendModeCapacityInput);
        contents.emplace_back("uint32_t", "environmentBlendModeCapacityInput", oss_environmentBlendModeCapacityInput.str());
        std::ostringstream oss_environmentBlendModeCountOutput;
        oss_environmentBlendModeCountOutput << std::hex << (environmentBlendModeCountOutput);
        contents.emplace_back("uint32_t*", "environmentBlendModeCountOutput", oss_environmentBlendModeCountOutput.str());
        std::ostringstream oss_environmentBlendModes;
        oss_environmentBlendModes << std::hex << reinterpret_cast<const void*>(environmentBlendModes);
        contents.emplace_back("XrEnvironmentBlendMode*", "environmentBlendModes", oss_environmentBlendModes.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->EnumerateEnvironmentBlendModes(instance, systemId, viewConfigurationType, environmentBlendModeCapacityInput, environmentBlendModeCountOutput, environmentBlendModes);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}